

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status hrgls_MessageCopy(hrgls_Message *returnMessage,hrgls_Message MessageToCopy)

{
  hrgls_Message_ *this;
  hrgls_Status hVar1;
  
  if (MessageToCopy == (hrgls_Message)0x0) {
    hVar1 = 0x3e9;
  }
  else {
    this = (hrgls_Message_ *)operator_new(0x38);
    (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
    (this->value)._M_string_length = 0;
    (this->value).field_2._M_local_buf[0] = '\0';
    hVar1 = 0;
    hrgls_Message_::operator=(this,MessageToCopy);
    *returnMessage = this;
  }
  return hVar1;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageCopy(hrgls_Message *returnMessage, hrgls_Message MessageToCopy)
  {
          if (!MessageToCopy) {
            return hrgls_STATUS_BAD_PARAMETER;
          }

	  hrgls_Status s = hrgls_STATUS_OKAY;
	  hrgls_Message ret;
	  try {
		  ret = new hrgls_Message_;
	  } catch (...) {
		  s = hrgls_STATUS_OUT_OF_MEMORY;
		  ret = nullptr;
	  }

	  *ret = *MessageToCopy;

	  *returnMessage = ret;
	  return s;
  }